

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O3

void lj_vmevent_call(lua_State *L,ptrdiff_t argbase)

{
  byte bVar1;
  undefined1 uVar2;
  uint64_t uVar3;
  int iVar4;
  
  uVar3 = (L->glref).ptr64;
  bVar1 = *(byte *)(uVar3 + 0x91);
  uVar2 = *(undefined1 *)(uVar3 + 0x93);
  *(undefined1 *)(uVar3 + 0x93) = 0;
  *(byte *)(uVar3 + 0x91) = bVar1 | 0x30;
  iVar4 = lj_vm_pcall(L,argbase + (L->stack).ptr64,1,0);
  if (iVar4 != 0) {
    lj_vmevent_call_cold_1();
  }
  *(byte *)(uVar3 + 0x91) = *(byte *)(uVar3 + 0x91) & 0xf | bVar1 & 0xf0;
  if (*(char *)(uVar3 + 0x93) != -1) {
    *(undefined1 *)(uVar3 + 0x93) = uVar2;
  }
  return;
}

Assistant:

void lj_vmevent_call(lua_State *L, ptrdiff_t argbase)
{
  global_State *g = G(L);
  uint8_t oldmask = g->vmevmask;
  uint8_t oldh = hook_save(g);
  int status;
  g->vmevmask = 0;  /* Disable all events. */
  hook_vmevent(g);
  status = lj_vm_pcall(L, restorestack(L, argbase), 0+1, 0);
  if (LJ_UNLIKELY(status)) {
    /* Really shouldn't use stderr here, but where else to complain? */
    L->top--;
    fputs("VM handler failed: ", stderr);
    fputs(tvisstr(L->top) ? strVdata(L->top) : "?", stderr);
    fputc('\n', stderr);
  }
  hook_restore(g, oldh);
  if (g->vmevmask != VMEVENT_NOCACHE)
    g->vmevmask = oldmask;  /* Restore event mask, but not if not modified. */
}